

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlHelper.cpp
# Opt level: O1

VariableType KDReports::XmlHelper::stringToVariableType(QString *type)

{
  bool bVar1;
  VariableType VVar2;
  QLatin1String s2;
  QLatin1String s2_00;
  QLatin1String s2_01;
  QLatin1String s2_02;
  QLatin1String s2_03;
  QLatin1String s2_04;
  QLatin1String s2_05;
  QLatin1String s2_06;
  char local_48 [8];
  char *local_40;
  char *local_38;
  char *local_30;
  QArrayDataPointer<char> local_28;
  
  s2.m_data = "pagenumber";
  s2.m_size = 10;
  bVar1 = operator==(type,s2);
  VVar2 = PageNumber;
  if (!bVar1) {
    s2_00.m_data = "pagecount";
    s2_00.m_size = 9;
    bVar1 = operator==(type,s2_00);
    VVar2 = PageCount;
    if (!bVar1) {
      s2_01.m_data = "textdate";
      s2_01.m_size = 8;
      bVar1 = operator==(type,s2_01);
      VVar2 = TextDate;
      if (!bVar1) {
        s2_02.m_data = "isodate";
        s2_02.m_size = 7;
        bVar1 = operator==(type,s2_02);
        VVar2 = ISODate;
        if (!bVar1) {
          s2_03.m_data = "localedate";
          s2_03.m_size = 10;
          bVar1 = operator==(type,s2_03);
          VVar2 = LocaleDate;
          if (!bVar1) {
            s2_04.m_data = "texttime";
            s2_04.m_size = 8;
            bVar1 = operator==(type,s2_04);
            VVar2 = TextTime;
            if (!bVar1) {
              s2_05.m_data = "isotime";
              s2_05.m_size = 7;
              bVar1 = operator==(type,s2_05);
              VVar2 = ISOTime;
              if (!bVar1) {
                s2_06.m_data = "localetime";
                s2_06.m_size = 10;
                bVar1 = operator==(type,s2_06);
                VVar2 = LocaleTime;
                if (!bVar1) {
                  local_48[0] = '\x02';
                  local_48[1] = '\0';
                  local_48[2] = '\0';
                  local_48[3] = '\0';
                  local_48[4] = '.';
                  local_48[5] = '\0';
                  local_48[6] = '\0';
                  local_48[7] = '\0';
                  local_40 = 
                  "/workspace/llm4binary/github/license_c_cmakelists/KDAB[P]KDReports/src/KDReports/KDReportsXmlHelper.cpp"
                  ;
                  local_38 = 
                  "static KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &)"
                  ;
                  local_30 = "default";
                  QString::toLocal8Bit_helper((QChar *)&local_28,(longlong)(type->d).ptr);
                  if (local_28.ptr == (char *)0x0) {
                    local_28.ptr = (char *)&QByteArray::_empty;
                  }
                  VVar2 = PageNumber;
                  QMessageLogger::warning(local_48,"Unexpected variable type: %s",local_28.ptr);
                  QArrayDataPointer<char>::~QArrayDataPointer(&local_28);
                }
              }
            }
          }
        }
      }
    }
  }
  return VVar2;
}

Assistant:

KDReports::VariableType KDReports::XmlHelper::stringToVariableType(const QString &type)
{
    if (type == QLatin1String("pagenumber"))
        return KDReports::PageNumber;
    else if (type == QLatin1String("pagecount"))
        return KDReports::PageCount;
    else if (type == QLatin1String("textdate"))
        return KDReports::TextDate;
    else if (type == QLatin1String("isodate"))
        return KDReports::ISODate;
    else if (type == QLatin1String("localedate"))
        return KDReports::LocaleDate;
    else if (type == QLatin1String("texttime"))
        return KDReports::TextTime;
    else if (type == QLatin1String("isotime"))
        return KDReports::ISOTime;
    else if (type == QLatin1String("localetime"))
        return KDReports::LocaleTime;
    qWarning("Unexpected variable type: %s", qPrintable(type));
    return KDReports::PageNumber;
}